

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# I64ToI32Lowering.cpp
# Opt level: O2

void __thiscall wasm::I64ToI32Lowering::visitStore(I64ToI32Lowering *this,Store *curr)

{
  uint uVar1;
  Builder *pBVar2;
  address64_t aVar3;
  Builder *this_00;
  bool bVar4;
  byte bVar5;
  Index IVar6;
  LocalSet *any;
  LocalGet *pLVar7;
  LocalGet *value;
  Store *args;
  Block *expression;
  byte bVar8;
  ulong uVar9;
  uint align;
  undefined1 local_88 [8];
  TempVar highBits;
  TempVar ptrTemp;
  
  bVar4 = hasOutParam(this,curr->value);
  if (bVar4) {
    if (0xfffffffffffffffb < (curr->offset).addr) {
      __assert_fail("curr->offset + 4 > curr->offset",
                    "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/passes/I64ToI32Lowering.cpp"
                    ,0x1cc,"void wasm::I64ToI32Lowering::visitStore(Store *)");
    }
    if (curr->isAtomic == true) {
      __assert_fail("!curr->isAtomic && \"atomic store not implemented\"",
                    "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/passes/I64ToI32Lowering.cpp"
                    ,0x1cd,"void wasm::I64ToI32Lowering::visitStore(Store *)");
    }
    fetchOutParam((TempVar *)local_88,this,curr->value);
    bVar5 = (byte)*(undefined4 *)&curr->bytes;
    bVar8 = bVar5;
    if (3 < bVar5) {
      bVar8 = 4;
    }
    uVar1 = (uint)(curr->align).addr;
    uVar9 = (ulong)uVar1;
    if (3 < uVar1) {
      uVar9 = 4;
    }
    curr->bytes = bVar8;
    (curr->align).addr = uVar9;
    (curr->valueType).id = 2;
    if (bVar5 == 8) {
      getTemp((TempVar *)&highBits.ty,this,(Type)0x2);
      pBVar2 = (this->builder)._M_t.
               super___uniq_ptr_impl<wasm::Builder,_std::default_delete<wasm::Builder>_>._M_t.
               super__Tuple_impl<0UL,_wasm::Builder_*,_std::default_delete<wasm::Builder>_>.
               super__Head_base<0UL,_wasm::Builder_*,_false>._M_head_impl;
      IVar6 = TempVar::operator_cast_to_unsigned_int((TempVar *)&highBits.ty);
      any = Builder::makeLocalSet(pBVar2,IVar6,curr->ptr);
      pBVar2 = (this->builder)._M_t.
               super___uniq_ptr_impl<wasm::Builder,_std::default_delete<wasm::Builder>_>._M_t.
               super__Tuple_impl<0UL,_wasm::Builder_*,_std::default_delete<wasm::Builder>_>.
               super__Head_base<0UL,_wasm::Builder_*,_false>._M_head_impl;
      IVar6 = TempVar::operator_cast_to_unsigned_int((TempVar *)&highBits.ty);
      pLVar7 = Builder::makeLocalGet(pBVar2,IVar6,(Type)0x2);
      curr->ptr = (Expression *)pLVar7;
      Store::finalize(curr);
      pBVar2 = (this->builder)._M_t.
               super___uniq_ptr_impl<wasm::Builder,_std::default_delete<wasm::Builder>_>._M_t.
               super__Tuple_impl<0UL,_wasm::Builder_*,_std::default_delete<wasm::Builder>_>.
               super__Head_base<0UL,_wasm::Builder_*,_false>._M_head_impl;
      aVar3 = (curr->offset).addr;
      uVar1 = (uint)(curr->align).addr;
      align = 4;
      if (uVar1 < 4) {
        align = uVar1;
      }
      IVar6 = TempVar::operator_cast_to_unsigned_int((TempVar *)&highBits.ty);
      pLVar7 = Builder::makeLocalGet(pBVar2,IVar6,(Type)0x2);
      this_00 = (this->builder)._M_t.
                super___uniq_ptr_impl<wasm::Builder,_std::default_delete<wasm::Builder>_>._M_t.
                super__Tuple_impl<0UL,_wasm::Builder_*,_std::default_delete<wasm::Builder>_>.
                super__Head_base<0UL,_wasm::Builder_*,_false>._M_head_impl;
      IVar6 = TempVar::operator_cast_to_unsigned_int((TempVar *)local_88);
      value = Builder::makeLocalGet(this_00,IVar6,(Type)0x2);
      args = Builder::makeStore(pBVar2,4,(Address)(aVar3 + 4),align,(Expression *)pLVar7,
                                (Expression *)value,(Type)0x2,(Name)(curr->memory).super_IString.str
                               );
      expression = Builder::blockify<wasm::Store*>
                             ((this->builder)._M_t.
                              super___uniq_ptr_impl<wasm::Builder,_std::default_delete<wasm::Builder>_>
                              ._M_t.
                              super__Tuple_impl<0UL,_wasm::Builder_*,_std::default_delete<wasm::Builder>_>
                              .super__Head_base<0UL,_wasm::Builder_*,_false>._M_head_impl,
                              (Expression *)any,(Expression *)curr,args);
      Walker<wasm::I64ToI32Lowering,_wasm::Visitor<wasm::I64ToI32Lowering,_void>_>::replaceCurrent
                (&(this->
                  super_WalkerPass<wasm::PostWalker<wasm::I64ToI32Lowering,_wasm::Visitor<wasm::I64ToI32Lowering,_void>_>_>
                  ).
                  super_PostWalker<wasm::I64ToI32Lowering,_wasm::Visitor<wasm::I64ToI32Lowering,_void>_>
                  .
                  super_Walker<wasm::I64ToI32Lowering,_wasm::Visitor<wasm::I64ToI32Lowering,_void>_>
                 ,(Expression *)expression);
      TempVar::~TempVar((TempVar *)&highBits.ty);
    }
    TempVar::~TempVar((TempVar *)local_88);
  }
  return;
}

Assistant:

void visitStore(Store* curr) {
    if (!hasOutParam(curr->value)) {
      return;
    }
    assert(curr->offset + 4 > curr->offset);
    assert(!curr->isAtomic && "atomic store not implemented");
    TempVar highBits = fetchOutParam(curr->value);
    uint8_t bytes = curr->bytes;
    curr->bytes = std::min(curr->bytes, uint8_t(4));
    curr->align = std::min(uint32_t(curr->align), uint32_t(4));
    curr->valueType = Type::i32;
    if (bytes == 8) {
      TempVar ptrTemp = getTemp();
      LocalSet* setPtr = builder->makeLocalSet(ptrTemp, curr->ptr);
      curr->ptr = builder->makeLocalGet(ptrTemp, Type::i32);
      curr->finalize();
      Store* storeHigh =
        builder->makeStore(4,
                           curr->offset + 4,
                           std::min(uint32_t(curr->align), uint32_t(4)),
                           builder->makeLocalGet(ptrTemp, Type::i32),
                           builder->makeLocalGet(highBits, Type::i32),
                           Type::i32,
                           curr->memory);
      replaceCurrent(builder->blockify(setPtr, curr, storeHigh));
    }
  }